

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_crypto.c
# Opt level: O2

_Bool i2p_dest_load(i2p_dest *dest,uint8_t *data,size_t sz)

{
  ushort uVar1;
  _Bool _Var2;
  long lVar3;
  uint8_t *puVar4;
  
  memcpy(dest,data,sz);
  dest->sz = sz;
  dest->enckey = dest->buf;
  if (dest->buf[0x180] == '\0') {
    dest->sigtype = 0;
    dest->enctype = 0;
    dest->sigkey = dest->buf + 0x100;
    (dest->cert).type = '\0';
    (dest->cert).sz = 0;
    lVar3 = 0x228;
    puVar4 = (uint8_t *)0x0;
LAB_00105eb6:
    *(uint8_t **)(dest->buf + lVar3) = puVar4;
    _Var2 = true;
  }
  else {
    if (dest->buf[0x180] == '\x05') {
      (dest->cert).type = '\x05';
      uVar1 = *(ushort *)(dest->buf + 0x183);
      (dest->cert).sz = *(ushort *)(dest->buf + 0x181) << 8 | *(ushort *)(dest->buf + 0x181) >> 8;
      dest->sigtype = uVar1 << 8 | uVar1 >> 8;
      dest->enctype = *(ushort *)(dest->buf + 0x185) << 8 | *(ushort *)(dest->buf + 0x185) >> 8;
      if (uVar1 == 0x700) {
        puVar4 = dest->buf + 0x160;
        lVar3 = 0x218;
        goto LAB_00105eb6;
      }
    }
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool i2p_dest_load(struct i2p_dest * dest, uint8_t * data, size_t sz)
{
  uint8_t * ptr = dest->buf;
  memcpy(ptr, data, sz);
  dest->sz = sz;
  dest->enckey = ptr;
  ptr += 256 + 128;
  if(*ptr == CERT_KEYCERT)
  {
    dest->cert.type = CERT_KEYCERT;
    ptr ++;
    dest->cert.sz = bufbe16toh(ptr);
    ptr += 2;
    dest->sigtype = bufbe16toh(ptr);
    ptr += 2;
    dest->enctype = bufbe16toh(ptr);
    if(dest->sigtype == EDDSA_KEYTYPE)
    {
      dest->sigkey = dest->buf + 256 + EDDSA_PADDING_BYTES;
      return true;
    }
  }
  else if(*ptr == CERT_NULL)
  {
    dest->sigtype = DSA_KEYTYPE;
    dest->enctype = ELG_KEYTYPE;
    dest->sigkey = dest->buf + 256;
    dest->cert.type = CERT_NULL;
    dest->cert.sz = 0;
    dest->cert.data = 0;
    return true;
  }
  return false;
}